

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_mul(secp256k1_scalar *r,secp256k1_scalar *a,secp256k1_scalar *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  uint64_t l [8];
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  uVar36 = a->d[0];
  uVar37 = b->d[0];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar37;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar36;
  local_78 = SUB168(auVar1 * auVar17,0);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SUB168(auVar1 * auVar17,8);
  uVar39 = b->d[1];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar39;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar36;
  auVar33 = auVar2 * auVar18 + auVar33;
  uVar53 = auVar33._0_8_;
  uVar44 = auVar33._8_8_;
  uVar38 = a->d[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar38;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar37;
  uVar40 = SUB168(auVar3 * auVar19,8);
  uVar35 = SUB168(auVar3 * auVar19,0);
  local_70 = uVar35 + uVar53;
  uVar53 = (ulong)CARRY8(uVar35,uVar53);
  uVar47 = uVar40 + uVar44;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar47 + uVar53;
  uVar35 = b->d[2];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar35;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar36;
  auVar34 = auVar4 * auVar20 + auVar34;
  uVar54 = auVar34._0_8_;
  uVar45 = auVar34._8_8_;
  uVar47 = (ulong)(CARRY8(uVar40,uVar44) || CARRY8(uVar47,uVar53));
  uVar46 = uVar45 + uVar47;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar38;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar39;
  uVar41 = SUB168(auVar5 * auVar21,8);
  uVar53 = SUB168(auVar5 * auVar21,0);
  uVar51 = uVar53 + uVar54;
  uVar40 = (ulong)CARRY8(uVar53,uVar54);
  uVar54 = uVar41 + uVar46;
  uVar50 = uVar54 + uVar40;
  uVar53 = a->d[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar53;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar37;
  uVar42 = SUB168(auVar6 * auVar22,8);
  uVar44 = SUB168(auVar6 * auVar22,0);
  local_68 = uVar44 + uVar51;
  uVar44 = (ulong)CARRY8(uVar44,uVar51);
  uVar51 = uVar42 + uVar50;
  uVar48 = uVar51 + uVar44;
  uVar49 = (ulong)(CARRY8(uVar41,uVar46) || CARRY8(uVar54,uVar40)) + (ulong)CARRY8(uVar45,uVar47) +
           (ulong)(CARRY8(uVar42,uVar50) || CARRY8(uVar51,uVar44));
  uVar47 = b->d[3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar47;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar36;
  uVar46 = SUB168(auVar7 * auVar23,8);
  uVar36 = SUB168(auVar7 * auVar23,0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar35;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar38;
  uVar50 = SUB168(auVar8 * auVar24,8);
  uVar44 = SUB168(auVar8 * auVar24,0);
  uVar54 = uVar36 + uVar48;
  uVar40 = (ulong)CARRY8(uVar36,uVar48);
  uVar51 = uVar46 + uVar49;
  uVar55 = uVar51 + uVar40;
  uVar42 = uVar54 + uVar44;
  uVar44 = (ulong)CARRY8(uVar54,uVar44);
  uVar41 = uVar55 + uVar50;
  uVar56 = uVar41 + uVar44;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar53;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar39;
  uVar48 = SUB168(auVar9 * auVar25,8);
  uVar36 = SUB168(auVar9 * auVar25,0);
  uVar45 = uVar36 + uVar42;
  uVar54 = (ulong)CARRY8(uVar36,uVar42);
  uVar42 = uVar48 + uVar56;
  uVar52 = uVar42 + uVar54;
  uVar36 = a->d[3];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar36;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar37;
  uVar43 = SUB168(auVar10 * auVar26,8);
  uVar37 = SUB168(auVar10 * auVar26,0);
  local_60 = uVar37 + uVar45;
  uVar37 = (ulong)CARRY8(uVar37,uVar45);
  uVar45 = uVar43 + uVar52;
  uVar57 = uVar45 + uVar37;
  uVar46 = (ulong)(CARRY8(uVar48,uVar56) || CARRY8(uVar42,uVar54)) +
           (ulong)(CARRY8(uVar55,uVar50) || CARRY8(uVar41,uVar44)) +
           (ulong)(CARRY8(uVar46,uVar49) || CARRY8(uVar51,uVar40)) +
           (ulong)(CARRY8(uVar43,uVar52) || CARRY8(uVar45,uVar37));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar47;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar38;
  uVar51 = SUB168(auVar11 * auVar27,8);
  uVar37 = SUB168(auVar11 * auVar27,0);
  uVar44 = uVar37 + uVar57;
  uVar37 = (ulong)CARRY8(uVar37,uVar57);
  uVar40 = uVar51 + uVar46;
  uVar50 = uVar40 + uVar37;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar53;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar35;
  uVar41 = SUB168(auVar12 * auVar28,8);
  uVar38 = SUB168(auVar12 * auVar28,0);
  uVar54 = uVar38 + uVar44;
  uVar38 = (ulong)CARRY8(uVar38,uVar44);
  uVar44 = uVar41 + uVar50;
  uVar45 = uVar44 + uVar38;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar36;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar39;
  uVar42 = SUB168(auVar13 * auVar29,8);
  uVar39 = SUB168(auVar13 * auVar29,0);
  local_58 = uVar39 + uVar54;
  uVar39 = (ulong)CARRY8(uVar39,uVar54);
  uVar54 = uVar42 + uVar45;
  uVar48 = uVar54 + uVar39;
  uVar54 = (ulong)(CARRY8(uVar41,uVar50) || CARRY8(uVar44,uVar38)) +
           (ulong)(CARRY8(uVar51,uVar46) || CARRY8(uVar40,uVar37)) +
           (ulong)(CARRY8(uVar42,uVar45) || CARRY8(uVar54,uVar39));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar47;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar53;
  uVar40 = SUB168(auVar14 * auVar30,8);
  uVar37 = SUB168(auVar14 * auVar30,0);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar36;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar35;
  uVar44 = SUB168(auVar15 * auVar31,8);
  uVar38 = SUB168(auVar15 * auVar31,0);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar36;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar47;
  uVar35 = SUB168(auVar16 * auVar32,0);
  uVar47 = uVar37 + uVar48;
  uVar36 = (ulong)CARRY8(uVar37,uVar48);
  uVar39 = uVar40 + uVar54;
  uVar53 = uVar39 + uVar36;
  local_50 = uVar47 + uVar38;
  uVar37 = (ulong)CARRY8(uVar47,uVar38);
  uVar38 = uVar53 + uVar44;
  uVar47 = uVar38 + uVar37;
  local_48 = uVar47 + uVar35;
  local_40 = (ulong)(CARRY8(uVar53,uVar44) || CARRY8(uVar38,uVar37)) +
             SUB168(auVar16 * auVar32,8) + (ulong)(CARRY8(uVar40,uVar54) || CARRY8(uVar39,uVar36)) +
             (ulong)CARRY8(uVar47,uVar35);
  secp256k1_scalar_reduce_512(r,&local_78);
  return;
}

Assistant:

static void secp256k1_scalar_mul(secp256k1_scalar *r, const secp256k1_scalar *a, const secp256k1_scalar *b) {
    uint64_t l[8];
    secp256k1_scalar_mul_512(l, a, b);
    secp256k1_scalar_reduce_512(r, l);
}